

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontStructMatrix.cpp
# Opt level: O2

void __thiscall
TPZFrontStructMatrix<TPZFrontSym<std::complex<double>_>,_std::complex<double>,_TPZStructMatrixOR<std::complex<double>_>_>
::Assemble(TPZFrontStructMatrix<TPZFrontSym<std::complex<double>_>,_std::complex<double>,_TPZStructMatrixOR<std::complex<double>_>_>
           *this,TPZBaseMatrix *stiff_base,TPZBaseMatrix *rhs_base,
          TPZAutoPointer<TPZGuiInterface> *guiInterface)

{
  TPZCompMesh *this_00;
  TPZCompEl *el;
  bool bVar1;
  int matid;
  long lVar2;
  TPZMatrix<std::complex<double>_> *stiffness;
  TPZFMatrix<std::complex<double>_> *rhs;
  int64_t size;
  TPZCompEl **ppTVar3;
  long *plVar4;
  ostream *poVar5;
  long nelem;
  long lVar6;
  long lVar7;
  int iStack_103f4;
  TPZVec<int> elorder;
  TPZElementMatrixT<std::complex<double>_> ef;
  TPZElementMatrixT<std::complex<double>_> ek;
  
  lVar2 = __dynamic_cast(stiff_base,&TPZBaseMatrix::typeinfo,
                         &TPZMatrix<std::complex<double>>::typeinfo,0);
  if (lVar2 != 0) {
    lVar2 = __dynamic_cast(rhs_base,&TPZBaseMatrix::typeinfo,
                           &TPZFMatrix<std::complex<double>>::typeinfo,0);
    if (lVar2 == 0) {
      stiffness = (TPZMatrix<std::complex<double>_> *)
                  __dynamic_cast(stiff_base,&TPZBaseMatrix::typeinfo,
                                 &TPZMatrix<std::complex<double>>::typeinfo,0);
      if (stiffness != (TPZMatrix<std::complex<double>_> *)0x0) {
        rhs = (TPZFMatrix<std::complex<double>_> *)
              __dynamic_cast(rhs_base,&TPZBaseMatrix::typeinfo,
                             &TPZFMatrix<std::complex<double>>::typeinfo,0);
        if (rhs != (TPZFMatrix<std::complex<double>_> *)0x0) {
          lVar2 = ((*(TPZCompMesh **)&this->field_0x8)->fElementVec).
                  super_TPZChunkVector<TPZCompEl_*,_10>.fNElements;
          TPZElementMatrixT<std::complex<double>_>::TPZElementMatrixT
                    (&ek,*(TPZCompMesh **)&this->field_0x8,EK);
          TPZElementMatrixT<std::complex<double>_>::TPZElementMatrixT
                    (&ef,*(TPZCompMesh **)&this->field_0x8,EF);
          this_00 = *(TPZCompMesh **)&this->field_0x8;
          size = TPZCompMesh::NEquations(this_00);
          iStack_103f4 = 0;
          TPZVec<int>::TPZVec(&elorder,size,&iStack_103f4);
          OrderElement(this);
          lVar6 = 0;
          if (0 < lVar2) {
            lVar6 = lVar2;
          }
          lVar7 = 0;
          lVar2 = 0;
          do {
            if (lVar6 == lVar2) {
              TPZVec<int>::~TPZVec(&elorder);
              TPZElementMatrixT<std::complex<double>_>::~TPZElementMatrixT(&ef);
              TPZElementMatrixT<std::complex<double>_>::~TPZElementMatrixT(&ek);
              return;
            }
            nelem = (long)(this->fElementOrder).fStore[lVar2];
            if (-1 < nelem) {
              ppTVar3 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                                  (&(this_00->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>,
                                   nelem);
              el = *ppTVar3;
              if (el != (TPZCompEl *)0x0) {
                plVar4 = (long *)(**(code **)(*(long *)el + 0xb8))(el);
                if (plVar4 != (long *)0x0) {
                  matid = (**(code **)(*plVar4 + 0x58))(plVar4);
                  bVar1 = ::TPZStructMatrix::ShouldCompute((TPZStructMatrix *)this,matid);
                  if (!bVar1) goto LAB_011c558a;
                }
                (**(code **)(*(long *)el + 0x110))(el,&ek,&ef);
                poVar5 = std::operator<<((ostream *)&std::cout," assemblando elemento frontal ");
                poVar5 = std::ostream::_M_insert<long>((long)poVar5);
                std::endl<char,std::char_traits<char>>(poVar5);
                AssembleElement(this,el,&ek.super_TPZElementMatrix,&ef.super_TPZElementMatrix,
                                stiffness,rhs);
                if (this->f_quiet == 0) {
                  std::operator<<((ostream *)&std::cout,'*');
                  if (lVar7 % 0x14 == 0) {
                    poVar5 = std::operator<<((ostream *)&std::cout," ");
                    poVar5 = std::ostream::_M_insert<long>((long)poVar5);
                    poVar5 = std::operator<<(poVar5,"% Elements assembled ");
                    std::endl<char,std::char_traits<char>>(poVar5);
                    std::ostream::flush();
                  }
                }
                lVar7 = lVar7 + 1;
              }
            }
LAB_011c558a:
            lVar2 = lVar2 + 1;
          } while( true );
        }
      }
      __cxa_bad_cast();
    }
  }
  std::operator<<((ostream *)&std::cerr,
                  "virtual void TPZFrontStructMatrix<TPZFrontSym<std::complex<double>>, std::complex<double>>::Assemble(TPZBaseMatrix &, TPZBaseMatrix &, TPZAutoPointer<TPZGuiInterface>) [TFront = TPZFrontSym<std::complex<double>>, TVar = std::complex<double>, TPar = TPZStructMatrixOR<CSTATE>]"
                 );
  std::operator<<((ostream *)&std::cerr," incompatible types. Aborting...\n");
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/StrMatrix/TPZFrontStructMatrix.cpp"
             ,0x145);
}

Assistant:

void TPZFrontStructMatrix<TFront,TVar,TPar>::Assemble(TPZBaseMatrix & stiff_base, TPZBaseMatrix & rhs_base, TPZAutoPointer<TPZGuiInterface> guiInterface){
    if(!dynamic_cast<TPZMatrix<TVar>*>(&stiff_base) ||
       dynamic_cast<TPZFMatrix<TVar>*>(&rhs_base)){
        PZError<<__PRETTY_FUNCTION__;
        PZError<<" incompatible types. Aborting...\n";
        DebugStop();
    }
	auto& stiffness = dynamic_cast<TPZMatrix<TVar>&>(stiff_base);
    auto& rhs = dynamic_cast<TPZFMatrix<TVar>&>(rhs_base);
	int64_t iel;
	int64_t numel = 0, nelem = this->fMesh->NElements();
	TPZElementMatrixT<TVar> ek(this->fMesh,TPZElementMatrix::EK),ef(this->fMesh,TPZElementMatrix::EF);
	
	TPZAdmChunkVector<TPZCompEl *> &elementvec = this->fMesh->ElementVec();
	
	
	/**Rearange elements order*/
	TPZVec<int> elorder(this->fMesh->NEquations(),0);
	
	OrderElement();
	
	for(iel=0; iel < nelem; iel++) {
		
        int64_t elindex = fElementOrder[iel];
		if(elindex < 0) continue;
		TPZCompEl *el = elementvec[elindex];
		if(!el) continue;
		TPZMaterial * mat = el->Material();
		if(mat)
		{
			int matid = mat->Id();
			if(this->ShouldCompute(matid) == false)
			{
				continue;
			}
		}
		else
		{
		}
		
		//		int dim = el->NumNodes();
		
		//Builds elements stiffness matrix
		el->CalcStiff(ek,ef);
		
		
		std::cout<< " assemblando elemento frontal " << iel <<std::endl;
		
#ifdef PZ_LOG
        if (logger.isDebugEnabled())
		{
			std::stringstream sout;
			ek.fMat.Print("Element stiffness Frontal",sout);
			LOGPZ_DEBUG(logger,sout.str())
		}
#endif
		
		AssembleElement(el, ek, ef, stiffness, rhs);
#ifdef PZ_LOG
		if(loggerel.isDebugEnabled())
		{
			std::stringstream sout;
			ek.fMat.Print("Element stiffness depois de assemblada ",sout);
			LOGPZ_DEBUG(loggerel,sout.str())
		}
#endif
		
		if(!f_quiet)
		{
			cout << '*';
			if(!(numel%20)) {
				cout << " " << (100*iel/nelem) << "% Elements assembled " << endl;
				cout.flush();
			}
		}
		numel++;
		
	}//fim for iel
	
}